

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O3

void __thiscall xray_re::xr_object::denominate_surfaces(xr_object *this)

{
  string *psVar1;
  char cVar2;
  xr_surface *pxVar3;
  pointer pcVar4;
  size_type sVar5;
  size_t __n;
  int iVar6;
  long lVar7;
  ulong uVar8;
  pointer ppxVar9;
  size_type sVar10;
  pointer ppxVar11;
  pointer ppxVar12;
  char suffix [8];
  char local_38 [8];
  
  ppxVar12 = (this->m_surfaces).
             super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppxVar9 = (this->m_surfaces).
            super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppxVar12 != ppxVar9) {
    do {
      pxVar3 = *ppxVar12;
      lVar7 = std::__cxx11::string::rfind((char)pxVar3 + -0x78,0x5c);
      psVar1 = &pxVar3->m_name;
      std::__cxx11::string::reserve((ulong)psVar1);
      pcVar4 = (pxVar3->m_texture)._M_dataplus._M_p;
      sVar5 = (pxVar3->m_texture)._M_string_length;
      if (pcVar4 + lVar7 + 1 != pcVar4 + sVar5) {
        sVar10 = lVar7 + 1;
        do {
          cVar2 = pcVar4[sVar10];
          iVar6 = isalnum((int)cVar2);
          if (iVar6 != 0) {
            tolower((int)cVar2);
          }
          std::__cxx11::string::push_back((char)psVar1);
          sVar10 = sVar10 + 1;
        } while (sVar5 != sVar10);
      }
      std::__cxx11::string::append((char *)psVar1);
      ppxVar12 = ppxVar12 + 1;
    } while (ppxVar12 != ppxVar9);
    ppxVar12 = (this->m_surfaces).
               super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppxVar9 = (this->m_surfaces).
              super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppxVar12 != ppxVar9) {
    uVar8 = (long)ppxVar9 - (long)ppxVar12 >> 3;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<xray_re::xr_surface**,std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<surface_name_pred>>
              (ppxVar12,ppxVar9,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<xray_re::xr_surface**,std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>>,__gnu_cxx::__ops::_Iter_comp_iter<surface_name_pred>>
              (ppxVar12,ppxVar9);
    ppxVar12 = (this->m_surfaces).
               super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppxVar9 = (this->m_surfaces).
              super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppxVar12 != ppxVar9) {
    do {
      ppxVar11 = ppxVar12 + 1;
      if (ppxVar11 != ppxVar9) {
        pxVar3 = *ppxVar12;
        uVar8 = 1;
        do {
          __n = ((*ppxVar11)->m_name)._M_string_length;
          if ((__n != (pxVar3->m_name)._M_string_length) ||
             ((__n != 0 &&
              (iVar6 = bcmp(((*ppxVar11)->m_name)._M_dataplus._M_p,(pxVar3->m_name)._M_dataplus._M_p
                            ,__n), iVar6 != 0)))) break;
          snprintf(local_38,8,"%u",uVar8);
          std::__cxx11::string::append((char *)&(*ppxVar11)->m_name);
          uVar8 = (ulong)((int)uVar8 + 1);
          ppxVar11 = ppxVar11 + 1;
        } while (ppxVar11 != ppxVar9);
      }
      ppxVar12 = ppxVar11;
    } while (ppxVar11 != ppxVar9);
  }
  return;
}

Assistant:

void xr_object::denominate_surfaces()
{
	for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end(); it != end; ++it) {
		xr_surface* surface = *it;
		const std::string& texture = surface->texture();
		std::string::size_type pos = texture.rfind('\\');
		if (pos == std::string::npos)
			pos = 0;
		else
			++pos;
		std::string& name = surface->name();
		name.reserve(texture.size() - pos + 3);
		for (std::string::const_iterator it1 = texture.begin() + pos,
				end1 = texture.end(); it1 != end1; ++it1) {
			int c = *it1;
			name.push_back(std::isalnum(c) ? char(std::tolower(c)) : '_');
		}
		name += "_S";
	}
	std::sort(m_surfaces.begin(), m_surfaces.end(), surface_name_pred());
	char suffix[8];
	for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end(); it != end;) {
		const std::string& name = (*it)->name();
		for (unsigned i = 1; ++it != end && (*it)->name() == name; ++i) {
			xr_snprintf(suffix, sizeof(suffix), "%u", i);
			(*it)->name() += suffix;
		}
	}
}